

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cc
# Opt level: O3

Value * __thiscall flow::IRBuilder::createSLen(IRBuilder *this,Value *value,string *name)

{
  long lVar1;
  UnaryInstr<(flow::UnaryOperator)3,_(flow::LiteralType)2> *pUVar2;
  string local_48;
  Value *local_28;
  size_type local_20;
  
  local_28 = value;
  if ((value == (Value *)0x0) ||
     (lVar1 = __dynamic_cast(value,&Value::typeinfo,
                             &ConstantValue<std::__cxx11::string,(flow::LiteralType)3>::typeinfo,0),
     lVar1 == 0)) {
    makeName(&local_48,this,name);
    pUVar2 = insert<flow::UnaryInstr<(flow::UnaryOperator)3,(flow::LiteralType)2>,flow::Value*&,std::__cxx11::string>
                       (this,&local_28,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p == &local_48.field_2) {
      return (Value *)pUVar2;
    }
  }
  else {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,*(long *)(lVar1 + 0x48),
               *(long *)(lVar1 + 0x50) + *(long *)(lVar1 + 0x48));
    local_20 = local_48._M_string_length;
    pUVar2 = (UnaryInstr<(flow::UnaryOperator)3,_(flow::LiteralType)2> *)
             IRProgram::get<flow::ConstantValue<long,(flow::LiteralType)2>,long>
                       (this->program_,&this->program_->numbers_,(long *)&local_20);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p == &local_48.field_2) {
      return (Value *)pUVar2;
    }
  }
  operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  return (Value *)pUVar2;
}

Assistant:

Value* IRBuilder::createSLen(Value* value, const std::string& name) {
  if (auto a = dynamic_cast<ConstantString*>(value))
    return get(a->get().size());

  return insert<SLenInstr>(value, makeName(name));
}